

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void indexedX16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  long lVar1;
  byte bVar2;
  cs_m680x_op *op;
  int16_t iVar3;
  long lVar4;
  
  lVar4 = (ulong)*address - (ulong)info->offset;
  lVar1 = lVar4 + 1;
  if ((uint)lVar1 < info->size) {
    iVar3 = CONCAT11(info->code[lVar4],info->code[lVar1]);
  }
  else {
    iVar3 = 0;
  }
  *address = *address + 2;
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  op = (info->m680x).operands + bVar2;
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  *(undefined8 *)&(info->m680x).operands[bVar2].field_1 = 0xd;
  (info->m680x).operands[bVar2].field_1.idx.offset = iVar3;
  *(undefined4 *)((long)&(info->m680x).operands[bVar2].field_1 + 10) = 0x100000;
  return;
}

Assistant:

static void indexedX16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	*address += 2;
	add_indexed_operand(info, M680X_REG_X, false, 0, M680X_OFFSET_BITS_16,
		offset, false);
}